

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O2

void density::f_default_construct::invoke<density_tests::PolymorphicBase>(void *i_dest)

{
  *(undefined8 *)((long)i_dest + 0x10) = 0;
  *(undefined8 *)((long)i_dest + 0x18) = 0;
  *(undefined8 *)i_dest = 0;
  *(undefined8 *)((long)i_dest + 8) = 0;
  density_tests::PolymorphicBase::PolymorphicBase((PolymorphicBase *)i_dest);
  return;
}

Assistant:

static void invoke(void * i_dest)
        {
            DENSITY_ASSUME(i_dest != nullptr);
            new (i_dest) TARGET_TYPE();
        }